

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void chebyshev3_set(int n,double *x,double *w)

{
  ostream *poVar1;
  
  switch(n) {
  case 1:
    *x = 0.0;
    *w = 3.141592653589793;
    break;
  case 2:
    *x = -1.0;
    x[1] = 1.0;
    *w = 1.570796326794897;
    w[1] = 1.570796326794897;
    break;
  case 3:
    *x = -1.0;
    x[1] = 0.0;
    x[2] = 1.0;
    *w = 0.7853981633974483;
    w[1] = 1.570796326794897;
    w[2] = 0.7853981633974483;
    break;
  case 4:
    *x = -1.0;
    x[1] = -0.5;
    x[2] = 0.5;
    x[3] = 1.0;
    *w = 0.5235987755982988;
    w[1] = 1.047197551196598;
    w[2] = 1.047197551196598;
    w[3] = 0.5235987755982988;
    break;
  case 5:
    *x = -1.0;
    x[1] = -0.7071067811865475;
    x[2] = 0.0;
    x[3] = 0.7071067811865476;
    x[4] = 1.0;
    *w = 0.3926990816987241;
    w[1] = 0.7853981633974483;
    w[2] = 0.7853981633974483;
    w[3] = 0.7853981633974483;
    w[4] = 0.3926990816987241;
    break;
  case 6:
    *x = -1.0;
    x[1] = -0.8090169943749473;
    x[2] = -0.3090169943749473;
    x[3] = 0.3090169943749475;
    x[4] = 0.8090169943749475;
    x[5] = 1.0;
    *w = 0.3141592653589793;
    w[1] = 0.6283185307179586;
    w[2] = 0.6283185307179586;
    w[3] = 0.6283185307179586;
    w[4] = 0.6283185307179586;
    w[5] = 0.3141592653589793;
    break;
  case 7:
    *x = -1.0;
    x[1] = -0.8660254037844387;
    x[2] = -0.5;
    x[3] = 0.0;
    x[4] = 0.5000000000000001;
    x[5] = 0.8660254037844387;
    x[6] = 1.0;
    *w = 0.2617993877991494;
    w[1] = 0.5235987755982988;
    w[2] = 0.5235987755982988;
    w[3] = 0.5235987755982988;
    w[4] = 0.5235987755982988;
    w[5] = 0.5235987755982988;
    w[6] = 0.2617993877991494;
    break;
  case 8:
    *x = -1.0;
    x[1] = -0.900968867902419;
    x[2] = -0.6234898018587335;
    x[3] = -0.2225209339563143;
    x[4] = 0.2225209339563144;
    x[5] = 0.6234898018587336;
    x[6] = 0.9009688679024191;
    x[7] = 1.0;
    *w = 0.2243994752564138;
    w[1] = 0.4487989505128276;
    w[2] = 0.4487989505128276;
    w[3] = 0.4487989505128276;
    w[4] = 0.4487989505128276;
    w[5] = 0.4487989505128276;
    w[6] = 0.4487989505128276;
    w[7] = 0.2243994752564138;
    break;
  case 9:
    *x = -1.0;
    x[1] = -0.9238795325112867;
    x[2] = -0.7071067811865475;
    x[3] = -0.3826834323650897;
    x[4] = 0.0;
    x[5] = 0.3826834323650898;
    x[6] = 0.7071067811865476;
    x[7] = 0.9238795325112867;
    x[8] = 1.0;
    *w = 0.1963495408493621;
    w[1] = 0.3926990816987241;
    w[2] = 0.3926990816987241;
    w[3] = 0.3926990816987241;
    w[4] = 0.3926990816987241;
    w[5] = 0.3926990816987241;
    w[6] = 0.3926990816987241;
    w[7] = 0.3926990816987241;
    w[8] = 0.1963495408493621;
    break;
  case 10:
    *x = -1.0;
    x[1] = -0.9396926207859083;
    x[2] = -0.7660444431189779;
    x[3] = -0.5;
    x[4] = -0.1736481776669303;
    x[5] = 0.1736481776669304;
    x[6] = 0.5000000000000001;
    x[7] = 0.766044443118978;
    x[8] = 0.9396926207859084;
    x[9] = 1.0;
    *w = 0.1745329251994329;
    w[1] = 0.3490658503988659;
    w[2] = 0.3490658503988659;
    w[3] = 0.3490658503988659;
    w[4] = 0.3490658503988659;
    w[5] = 0.3490658503988659;
    w[6] = 0.3490658503988659;
    w[7] = 0.3490658503988659;
    w[8] = 0.3490658503988659;
    w[9] = 0.1745329251994329;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"CHEBYSHEV3_SET - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  Legal values are 1 through 10.\n");
    exit(1);
  }
  return;
}

Assistant:

void chebyshev3_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV3_SET sets a Chebyshev Type 3 quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      integral ( -1 <= x <= 1 ) f(x) / sqrt ( 1 - x * x ) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    28 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, integer N, the order.
//    N must be between 1 and 10.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[0] =    0.000000000000000;
    w[0] =    3.141592653589793;
  }
  else if ( n == 2 )
  {    
    x[0] =   -1.000000000000000;    
    x[1] =    1.000000000000000;    
    w[0] =    1.570796326794897;    
    w[1] =    1.570796326794897;
  }
  else if ( n == 3 )
  {  
    x[0] =   -1.000000000000000;    
    x[1] =   0.0;
    x[2] =    1.000000000000000;    
    w[0] =   0.7853981633974483;    
    w[1] =    1.570796326794897;    
    w[2] =   0.7853981633974483;
  }
  else if ( n == 4 )
  {    
    x[0] =   -1.000000000000000;    
    x[1] =  -0.5000000000000000;    
    x[2] =   0.5000000000000000;    
    x[3] =    1.000000000000000;    
    w[0] =   0.5235987755982988;    
    w[1] =    1.047197551196598;    
    w[2] =    1.047197551196598;    
    w[3] =   0.5235987755982988;
  }
  else if ( n == 5 )
  {    
    x[0] =   -1.000000000000000;    
    x[1] =  -0.7071067811865475;    
    x[2] =   0.0;
    x[3] =   0.7071067811865476;    
    x[4] =    1.000000000000000;    
    w[0] =   0.3926990816987241;    
    w[1] =   0.7853981633974483;    
    w[2] =   0.7853981633974483;    
    w[3] =   0.7853981633974483;    
    w[4] =   0.3926990816987241;
  }
  else if ( n == 6 )
  {   
    x[0] =   -1.000000000000000;    
    x[1] =  -0.8090169943749473;    
    x[2] =  -0.3090169943749473;    
    x[3] =   0.3090169943749475;    
    x[4] =   0.8090169943749475;    
    x[5] =    1.000000000000000;    
    w[0] =   0.3141592653589793;    
    w[1] =   0.6283185307179586;    
    w[2] =   0.6283185307179586;    
    w[3] =   0.6283185307179586;    
    w[4] =   0.6283185307179586;    
    w[5] =   0.3141592653589793;
  }
  else if ( n == 7 )
  {    
    x[0] =   -1.000000000000000;    
    x[1] =  -0.8660254037844387;    
    x[2] =  -0.5000000000000000;    
    x[3] =   0.0;
    x[4] =   0.5000000000000001;    
    x[5] =   0.8660254037844387;    
    x[6] =    1.000000000000000;    
    w[0] =   0.2617993877991494;    
    w[1] =   0.5235987755982988;    
    w[2] =   0.5235987755982988;    
    w[3] =   0.5235987755982988;    
    w[4] =   0.5235987755982988;    
    w[5] =   0.5235987755982988;    
    w[6] =   0.2617993877991494;
  }
  else if ( n == 8 )
  {    
    x[0] =   -1.000000000000000;    
    x[1] =  -0.9009688679024190;    
    x[2] =  -0.6234898018587335;    
    x[3] =  -0.2225209339563143;    
    x[4] =   0.2225209339563144;    
    x[5] =   0.6234898018587336;    
    x[6] =   0.9009688679024191;    
    x[7] =    1.000000000000000;    
    w[0] =   0.2243994752564138;    
    w[1] =   0.4487989505128276;    
    w[2] =   0.4487989505128276;    
    w[3] =   0.4487989505128276;    
    w[4] =   0.4487989505128276;    
    w[5] =   0.4487989505128276;    
    w[6] =   0.4487989505128276;    
    w[7] =   0.2243994752564138;
  }
  else if ( n == 9 )
  {    
    x[0] =   -1.000000000000000;    
    x[1] =  -0.9238795325112867;    
    x[2] =  -0.7071067811865475;    
    x[3] =  -0.3826834323650897;    
    x[4] =   0.0;
    x[5] =   0.3826834323650898;    
    x[6] =   0.7071067811865476;    
    x[7] =   0.9238795325112867;    
    x[8] =    1.000000000000000;    
    w[0] =   0.1963495408493621;    
    w[1] =   0.3926990816987241;    
    w[2] =   0.3926990816987241;    
    w[3] =   0.3926990816987241;    
    w[4] =   0.3926990816987241;    
    w[5] =   0.3926990816987241;    
    w[6] =   0.3926990816987241;    
    w[7] =   0.3926990816987241;    
    w[8] =   0.1963495408493621;
  }
  else if ( n == 10 )
  {    
    x[0] =   -1.000000000000000;    
    x[1] =  -0.9396926207859083;    
    x[2] =  -0.7660444431189779;    
    x[3] =  -0.5000000000000000;    
    x[4] =  -0.1736481776669303;    
    x[5] =   0.1736481776669304;    
    x[6] =   0.5000000000000001;    
    x[7] =   0.7660444431189780;    
    x[8] =   0.9396926207859084;    
    x[9] =    1.000000000000000;    
    w[0] =   0.1745329251994329;    
    w[1] =   0.3490658503988659;    
    w[2] =   0.3490658503988659;    
    w[3] =   0.3490658503988659;    
    w[4] =   0.3490658503988659;    
    w[5] =   0.3490658503988659;    
    w[6] =   0.3490658503988659; 
    w[7] =   0.3490658503988659;    
    w[8] =   0.3490658503988659;    
    w[9] =   0.1745329251994329;    
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "CHEBYSHEV3_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 through 10.\n";
    exit ( 1 );
  }

  return;
}